

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

Matrix * MatrixOrtho(Matrix *__return_storage_ptr__,double left,double right,double bottom,
                    double top,double near,double far)

{
  float fVar1;
  undefined4 uVar2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar3 [16];
  
  uVar2 = (undefined4)((ulong)(far - near) >> 0x20);
  fVar1 = (float)(far - near);
  __return_storage_ptr__->m0 = 2.0 / (float)(right - left);
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 2.0 / (float)(top - bottom);
  auVar4._0_8_ = (undefined8)DAT_0015d820;
  auVar4._8_4_ = DAT_0015d820._4_4_;
  auVar4._12_4_ = (uint)((ulong)near >> 0x20) ^ 0x80000000;
  auVar3._8_8_ = auVar4._8_8_;
  auVar3._0_8_ = CONCAT44((float)near + (float)far,(int)DAT_0015d820) ^ 0x8000000000000000;
  auVar5._4_4_ = fVar1;
  auVar5._0_4_ = fVar1;
  auVar5._8_4_ = uVar2;
  auVar5._12_4_ = uVar2;
  auVar5 = divps(auVar3,auVar5);
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = (float)(int)auVar5._0_8_;
  __return_storage_ptr__->m14 = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m12 = -((float)right + (float)left) / (float)(right - left);
  __return_storage_ptr__->m13 = -((float)bottom + (float)top) / (float)(top - bottom);
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixOrtho(double left, double right, double bottom, double top, double near, double far)
{
    Matrix result = { 0 };

    float rl = (float)(right - left);
    float tb = (float)(top - bottom);
    float fn = (float)(far - near);

    result.m0 = 2.0f/rl;
    result.m1 = 0.0f;
    result.m2 = 0.0f;
    result.m3 = 0.0f;
    result.m4 = 0.0f;
    result.m5 = 2.0f/tb;
    result.m6 = 0.0f;
    result.m7 = 0.0f;
    result.m8 = 0.0f;
    result.m9 = 0.0f;
    result.m10 = -2.0f/fn;
    result.m11 = 0.0f;
    result.m12 = -((float)left + (float)right)/rl;
    result.m13 = -((float)top + (float)bottom)/tb;
    result.m14 = -((float)far + (float)near)/fn;
    result.m15 = 1.0f;

    return result;
}